

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O2

void __thiscall
OpenMPDeclareMapperDirective::OpenMPDeclareMapperDirective
          (OpenMPDeclareMapperDirective *this,OpenMPDeclareMapperDirectiveIdentifier _identifier)

{
  OpenMPDirective::OpenMPDirective
            (&this->super_OpenMPDirective,OMPD_declare_mapper,Lang_unknown,0,0);
  (this->user_defined_identifier)._M_dataplus._M_p =
       (pointer)&(this->user_defined_identifier).field_2;
  (this->user_defined_identifier)._M_string_length = 0;
  (this->user_defined_identifier).field_2._M_local_buf[0] = '\0';
  (this->type_var)._M_dataplus._M_p = (pointer)&(this->type_var).field_2;
  (this->type_var)._M_string_length = 0;
  (this->type_var).field_2._M_local_buf[0] = '\0';
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->var)._M_dataplus._M_p = (pointer)&(this->var).field_2;
  (this->var)._M_string_length = 0;
  (this->var).field_2._M_local_buf[0] = '\0';
  this->identifier = _identifier;
  return;
}

Assistant:

OpenMPDeclareMapperDirective(OpenMPDeclareMapperDirectiveIdentifier _identifier) :
            OpenMPDirective(OMPD_declare_mapper){ identifier = _identifier;}